

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::
addEvent<std::unique_ptr<int,std::default_delete<int>>const&,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>const&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          unique_ptr<int,_std::default_delete<int>_> *args,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *args_1)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  undefined4 uVar2;
  Queue *pQVar3;
  void *result;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  size_t sizes [4];
  long local_58 [5];
  
  local_58[0] = 8;
  local_58[1] = 8;
  local_58[2] = (ulong)((args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) * 4 + 1;
  sVar4 = mserialize::detail::
          BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
          ::sizeof_elems(args_1);
  local_58[3] = sVar4 + 4;
  lVar7 = 0;
  lVar8 = 0;
  lVar5 = 0;
  do {
    lVar7 = lVar7 + local_58[lVar5];
    lVar8 = lVar8 + local_58[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 4);
  minQueueCapacity = lVar8 + lVar7 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar4 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar4 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar4 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar4 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)(lVar8 + lVar7);
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 4;
  *(uint64_t *)(pcVar6 + 4) = eventSourceId;
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + 8;
  *(uint64_t *)(pcVar6 + 8) = clock;
  pcVar6 = (this->_qw)._writePos + 8;
  (this->_qw)._writePos = pcVar6;
  if ((args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl == (int *)0x0) {
    *pcVar6 = '\0';
    lVar5 = 1;
  }
  else {
    *pcVar6 = '\x01';
    pcVar6 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar6 + 1;
    *(int *)(pcVar6 + 1) =
         *(args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl;
    lVar5 = 4;
  }
  pcVar6 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar6 + lVar5;
  uVar2 = (undefined4)(args_1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)(pcVar6 + lVar5) = uVar2;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 4;
  mserialize::detail::
  BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
  ::serialize_elems<binlog::detail::QueueWriter>(args_1,uVar2,this_00);
  pQVar3 = (this->_qw)._queue;
  (pQVar3->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar3->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}